

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

void __thiscall
QCommandLineOption::QCommandLineOption
          (QCommandLineOption *this,QString *name,QString *description,QString *valueName,
          QString *defaultValue)

{
  QCommandLineOptionPrivate *data;
  QCommandLineOptionPrivate *in_RCX;
  QCommandLineOption *in_RDI;
  QString *in_R8;
  
  data = (QCommandLineOptionPrivate *)operator_new(0x70);
  QCommandLineOptionPrivate::QCommandLineOptionPrivate(in_RCX,in_R8);
  QSharedDataPointer<QCommandLineOptionPrivate>::QSharedDataPointer(&in_RDI->d,data);
  setValueName(in_RDI,(QString *)data);
  setDescription(in_RDI,(QString *)data);
  setDefaultValue((QCommandLineOption *)in_RCX,in_R8);
  return;
}

Assistant:

QCommandLineOption::QCommandLineOption(const QString &name, const QString &description,
                                       const QString &valueName,
                                       const QString &defaultValue)
    : d(new QCommandLineOptionPrivate(name))
{
    setValueName(valueName);
    setDescription(description);
    setDefaultValue(defaultValue);
}